

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>,Eigen::internal::assign_op<int,int>>
               (Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
               *src,assign_op<int,_int> *func)

{
  ActualDstType actualDst;
  assign_op<int,_int> *func_local;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  *src_local;
  Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *dst_local;
  
  Assignment<Eigen::Map<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<int,_int>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,src,func);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);

  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);

  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}